

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteTargetRebuildManifest(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmOutputConverter *this_00;
  cmLocalGenerator *this_01;
  cmGeneratedFileStream *os_00;
  cmMakefile *pcVar1;
  string *psVar2;
  ostream *poVar3;
  char *pcVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  mapped_type *pmVar5;
  pointer ppcVar6;
  allocator local_31f;
  allocator local_31e;
  allocator local_31d;
  allocator local_31c;
  allocator local_31b;
  allocator local_31a;
  allocator local_319;
  string local_318;
  undefined1 local_2f8 [32];
  _Base_ptr local_2d8;
  size_t local_2d0;
  string local_2c8;
  cmNinjaDeps implicitDeps;
  string ninjaBuildFile;
  string local_258;
  string local_238;
  string local_218;
  cmNinjaVars variables;
  cmNinjaDeps local_1c8;
  ostringstream cmd;
  
  this_01 = *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmd);
  psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  this_00 = &this_01->super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat((string *)&variables,this_00,psVar2,SHELL);
  poVar3 = std::operator<<((ostream *)&cmd,(string *)&variables);
  poVar3 = std::operator<<(poVar3," -H");
  pcVar4 = cmLocalGenerator::GetSourceDirectory(this_01);
  std::__cxx11::string::string((string *)&ninjaBuildFile,pcVar4,(allocator *)&implicitDeps);
  cmOutputConverter::ConvertToOutputFormat((string *)local_2f8,this_00,&ninjaBuildFile,SHELL);
  poVar3 = std::operator<<(poVar3,(string *)local_2f8);
  poVar3 = std::operator<<(poVar3," -B");
  pcVar4 = cmLocalGenerator::GetBinaryDirectory(this_01);
  std::__cxx11::string::string((string *)&local_2c8,pcVar4,(allocator *)&local_258);
  cmOutputConverter::ConvertToOutputFormat(&local_318,this_00,&local_2c8,SHELL);
  std::operator<<(poVar3,(string *)&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&ninjaBuildFile);
  std::__cxx11::string::~string((string *)&variables);
  os_00 = this->RulesFileStream;
  std::__cxx11::string::string((string *)&variables,"RERUN_CMAKE",(allocator *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&ninjaBuildFile,"Re-running CMake...",&local_31d);
  std::__cxx11::string::string((string *)&local_318,"Rule for re-running cmake.",&local_31e);
  std::__cxx11::string::string((string *)&local_2c8,"",&local_31f);
  std::__cxx11::string::string((string *)&implicitDeps,"",&local_319);
  std::__cxx11::string::string((string *)&local_258,"",&local_31a);
  std::__cxx11::string::string((string *)&local_238,"",&local_31b);
  std::__cxx11::string::string((string *)&local_218,"",&local_31c);
  WriteRule((ostream *)os_00,(string *)&variables,(string *)local_2f8,&ninjaBuildFile,&local_318,
            &local_2c8,(string *)&implicitDeps,&local_258,&local_238,&local_218,true);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&implicitDeps);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&ninjaBuildFile);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&variables);
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (ppcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppcVar6 !=
      (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
    pcVar1 = (*ppcVar6)->Makefile;
    for (psVar2 = (pcVar1->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar2 != (pcVar1->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
      ConvertToNinjaPath((string *)&variables,this,psVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&implicitDeps,
                 (string *)&variables);
      std::__cxx11::string::~string((string *)&variables);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&implicitDeps,&this->CMakeCacheFile);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (implicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             implicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (implicitDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       implicitDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&implicitDeps,(const_iterator)__first._M_current,
          (const_iterator)
          implicitDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &variables._M_t._M_impl.super__Rb_tree_header._M_header;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->NinjaSupportsConsolePool == true) {
    std::__cxx11::string::string((string *)local_2f8,"pool",(allocator *)&ninjaBuildFile);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&variables,(key_type *)local_2f8);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)local_2f8);
  }
  std::__cxx11::string::string((string *)local_2f8,NINJA_BUILD_FILE,(allocator *)&local_318);
  NinjaOutputPath(&ninjaBuildFile,this,(string *)local_2f8);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::string
            ((string *)local_2f8,"Re-run CMake if any of its inputs changed.",&local_31d);
  std::__cxx11::string::string((string *)&local_318,"RERUN_CMAKE",&local_31e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_258,1,&ninjaBuildFile,(allocator_type *)&local_31f);
  local_238.field_2._M_allocated_capacity = 0;
  local_218.field_2._M_allocated_capacity = 0;
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_238._M_string_length = 0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218._M_dataplus._M_p = (pointer)0x0;
  local_218._M_string_length = 0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_allocated_capacity =
       local_2c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  WriteBuild(this,os,(string *)local_2f8,&local_318,(cmNinjaDeps *)&local_258,
             (cmNinjaDeps *)&local_238,(cmNinjaDeps *)&local_218,&implicitDeps,&local_1c8,&variables
             ,&local_2c8,0,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_258);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::string
            ((string *)&local_318,"A missing CMake input file is not an error.",
             (allocator *)&local_218);
  local_2c8.field_2._M_allocated_capacity = 0;
  local_258.field_2._M_allocated_capacity = 0;
  local_2c8._M_dataplus._M_p = (pointer)0x0;
  local_2c8._M_string_length = 0;
  local_238.field_2._M_allocated_capacity = 0;
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_238._M_string_length = 0;
  local_2f8._24_8_ = local_2f8 + 8;
  local_2f8._0_8_ = (pointer)0x0;
  local_2f8._8_8_ = 0;
  local_2f8._16_8_ = 0;
  local_2d0 = 0;
  local_2d8 = (_Base_ptr)local_2f8._24_8_;
  WritePhonyBuild(this,os,&local_318,&implicitDeps,(cmNinjaDeps *)&local_2c8,
                  (cmNinjaDeps *)&local_258,(cmNinjaDeps *)&local_238,(cmNinjaVars *)local_2f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&ninjaBuildFile);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&variables._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDeps);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmd);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetRebuildManifest(std::ostream& os)
{
  cmLocalGenerator* lg = this->LocalGenerators[0];

  std::ostringstream cmd;
  cmd << lg->ConvertToOutputFormat(cmSystemTools::GetCMakeCommand(),
                                   cmOutputConverter::SHELL)
      << " -H"
      << lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                   cmOutputConverter::SHELL)
      << " -B"
      << lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                   cmOutputConverter::SHELL);
  WriteRule(*this->RulesFileStream, "RERUN_CMAKE", cmd.str(),
            "Re-running CMake...", "Rule for re-running cmake.",
            /*depfile=*/"",
            /*deptype=*/"",
            /*rspfile=*/"",
            /*rspcontent*/ "",
            /*restat=*/"",
            /*generator=*/true);

  cmNinjaDeps implicitDeps;
  for (std::vector<cmLocalGenerator*>::const_iterator i =
         this->LocalGenerators.begin();
       i != this->LocalGenerators.end(); ++i) {
    std::vector<std::string> const& lf = (*i)->GetMakefile()->GetListFiles();
    for (std::vector<std::string>::const_iterator fi = lf.begin();
         fi != lf.end(); ++fi) {
      implicitDeps.push_back(this->ConvertToNinjaPath(*fi));
    }
  }
  implicitDeps.push_back(this->CMakeCacheFile);

  std::sort(implicitDeps.begin(), implicitDeps.end());
  implicitDeps.erase(std::unique(implicitDeps.begin(), implicitDeps.end()),
                     implicitDeps.end());

  cmNinjaVars variables;
  // Use 'console' pool to get non buffered output of the CMake re-run call
  // Available since Ninja 1.5
  if (SupportsConsolePool()) {
    variables["pool"] = "console";
  }

  std::string const ninjaBuildFile = this->NinjaOutputPath(NINJA_BUILD_FILE);
  this->WriteBuild(os, "Re-run CMake if any of its inputs changed.",
                   "RERUN_CMAKE",
                   /*outputs=*/cmNinjaDeps(1, ninjaBuildFile),
                   /*implicitOuts=*/cmNinjaDeps(),
                   /*explicitDeps=*/cmNinjaDeps(), implicitDeps,
                   /*orderOnlyDeps=*/cmNinjaDeps(), variables);

  this->WritePhonyBuild(os, "A missing CMake input file is not an error.",
                        implicitDeps, cmNinjaDeps());
}